

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O1

qreal QtGuiTest::scaleFactor(QWindow *window)

{
  QDebug this;
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  ScaleAndOrigin SVar2;
  QDebug local_58;
  Stream *local_50;
  undefined1 local_48 [8];
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lcQtGuiTest();
  if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    QMessageLogger::debug();
    this.stream = local_58.stream;
    QVar1.m_data = (storage_type *)0x1c;
    QVar1.m_size = (qsizetype)&local_40;
    QString::fromUtf8(QVar1);
    QTextStream::operator<<(&(this.stream)->ts,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((local_58.stream)->space == true) {
      QTextStream::operator<<(&(local_58.stream)->ts,' ');
    }
    local_50 = local_58.stream;
    (local_58.stream)->ref = (local_58.stream)->ref + 1;
    ::operator<<((Stream *)local_48,(QWindow *)&local_50);
    QDebug::~QDebug((QDebug *)local_48);
    QDebug::~QDebug((QDebug *)&local_50);
    QDebug::~QDebug(&local_58);
  }
  SVar2 = QHighDpiScaling::scaleAndOrigin(window,(Point)ZEXT812(0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return SVar2.factor;
  }
  __stack_chk_fail();
}

Assistant:

qreal QtGuiTest::scaleFactor(const QWindow *window)
{
    Q_ASSERT_X(window,
               Q_FUNC_INFO,
               "called with nullptr");

    deb << "Calculating scaling factor: " << window;
    return QHighDpiScaling::factor(window);
}